

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1ToType2Converter.cpp
# Opt level: O2

EStatusCode __thiscall
Type1ToType2Converter::RecordOperatorWithParameters
          (Type1ToType2Converter *this,unsigned_short inMarkerType,LongList *inOperandList)

{
  LongList *this_00;
  _List_node_base *p_Var1;
  ConversionNode node;
  value_type local_40;
  
  this_00 = &local_40.mOperands;
  local_40.mOperands.super__List_base<long,_std::allocator<long>_>._M_impl._M_node._M_size = 0;
  local_40.mOperands.super__List_base<long,_std::allocator<long>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this_00;
  local_40.mOperands.super__List_base<long,_std::allocator<long>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this_00;
  std::__cxx11::list<ConversionNode,_std::allocator<ConversionNode>_>::push_back
            (&this->mConversionProgram,&local_40);
  p_Var1 = (this->mConversionProgram).
           super__List_base<ConversionNode,_std::allocator<ConversionNode>_>._M_impl._M_node.
           super__List_node_base._M_prev;
  *(unsigned_short *)&p_Var1[1]._M_next = inMarkerType;
  std::__cxx11::list<long,_std::allocator<long>_>::operator=
            ((list<long,_std::allocator<long>_> *)&p_Var1[1]._M_prev,inOperandList);
  std::__cxx11::_List_base<long,_std::allocator<long>_>::_M_clear
            (&this_00->super__List_base<long,_std::allocator<long>_>);
  return eSuccess;
}

Assistant:

EStatusCode Type1ToType2Converter::RecordOperatorWithParameters(unsigned short inMarkerType,const LongList& inOperandList)
{
	ConversionNode node;
	mConversionProgram.push_back(node);
	mConversionProgram.back().mMarkerType = inMarkerType;
	mConversionProgram.back().mOperands = inOperandList;
	return eSuccess;
}